

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManDeriveMapping(Jf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  undefined8 uVar3;
  word *pwVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  pJVar2 = p->pPars;
  if (pJVar2->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x60d,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  uVar7 = p->pGia->nObjs;
  iVar8 = (int)pJVar2->Edge + uVar7;
  iVar1 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < (iVar8 + iVar1 * 2) - 1U) {
    iVar10 = iVar8 + iVar1 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar5;
  if (iVar10 < (int)uVar7) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar7 << 2);
    }
    p_00->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    memset(p_00->pArray,0,(ulong)uVar7 * 4);
  }
  p_00->nSize = uVar7;
  pGVar6 = p->pGia;
  uVar9 = (ulong)(uint)pGVar6->nObjs;
  if (0 < pGVar6->nObjs) {
    lVar12 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(pGVar6->pObjs + lVar12);
      uVar7 = (uint)uVar3;
      if (((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) &&
         ((((int)uVar7 < 0 || ((uVar7 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar7 & 0x1fffffff) != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))))) {
        if ((int)uVar9 <= lVar12) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (pGVar6->pRefs[lVar12] != 0) {
          if ((p->vCuts).nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar7 = (p->vCuts).pArray[lVar12];
          if (p_00->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pwVar4 = (p->pMem).pPages[(int)uVar7 >> ((byte)(p->pMem).nPageSize & 0x1f)];
          lVar11 = (long)(int)(uVar7 & (p->pMem).uPageMask);
          p_00->pArray[lVar12] = p_00->nSize;
          if ((p->pPars->fCutMin != 0) && (6 < (*(uint *)((long)pwVar4 + lVar11 * 8 + 4) & 0xf))) {
            __assert_fail("!p->pPars->fCutMin || Jf_CutSize(pCut) <= 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x616,"void Jf_ManDeriveMapping(Jf_Man_t *)");
          }
          Vec_IntPush(p_00,*(uint *)((long)pwVar4 + lVar11 * 8 + 4) & 0xf);
          if ((*(byte *)((long)pwVar4 + lVar11 * 8 + 4) & 0xf) != 0) {
            uVar9 = 0;
            do {
              uVar7 = *(uint *)((long)pwVar4 + uVar9 * 4 + lVar11 * 8 + 8);
              if ((int)uVar7 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              Vec_IntPush(p_00,uVar7 >> 1);
              uVar9 = uVar9 + 1;
            } while (uVar9 < (*(uint *)((long)pwVar4 + lVar11 * 8 + 4) & 0xf));
          }
          Vec_IntPush(p_00,(int)lVar12);
        }
      }
      lVar12 = lVar12 + 1;
      pGVar6 = p->pGia;
      uVar9 = (ulong)pGVar6->nObjs;
    } while (lVar12 < (long)uVar9);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x61c,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  pGVar6->vMapping = p_00;
  return;
}

Assistant:

void Jf_ManDeriveMapping( Jf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        assert( !p->pPars->fCutMin || Jf_CutSize(pCut) <= 6 );
        Vec_IntPush( vMapping, Jf_CutSize(pCut) );
        for ( k = 1; k <= Jf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Jf_CutVar(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
}